

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeDrawList
               (ImGuiWindow *window,ImGuiViewportP *viewport,ImDrawList *draw_list,char *label)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImDrawVert *pIVar3;
  ImGuiTable *table;
  bool bVar4;
  uint uVar5;
  ImGuiWindow *window_1;
  long lVar6;
  bool show_mesh;
  char *pcVar7;
  uint uVar8;
  ImDrawList *pIVar9;
  uint uVar10;
  ImGuiContext *pIVar11;
  unsigned_short *puVar12;
  ImVec4 *buf_00;
  ImDrawList *draw_list_00;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ImDrawCmd *pIVar16;
  bool bVar17;
  bool bVar18;
  undefined4 uVar19;
  float fVar20;
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char buf [300];
  ImGuiListClipper local_1f8;
  ImDrawList *local_1d0;
  uint local_1c4;
  ImGuiContext *local_1c0;
  ImDrawList *local_1b8;
  ImDrawCmd *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long local_198;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  iVar13 = (draw_list->CmdBuffer).Size;
  lVar14 = (long)iVar13;
  if ((0 < lVar14) && (pIVar16 = (draw_list->CmdBuffer).Data, pIVar16[lVar14 + -1].ElemCount == 0))
  {
    iVar13 = iVar13 - (uint)(pIVar16[lVar14 + -1].UserCallback == (ImDrawCallback)0x0);
  }
  local_1c0 = GImGui;
  pcVar7 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar7 = draw_list->_OwnerName;
  }
  bVar4 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar7,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar13);
  pIVar11 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  local_1b8 = draw_list;
  if (pIVar2->DrawList == draw_list) {
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (pIVar11->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar4) {
      return;
    }
  }
  else {
    if (viewport == (ImGuiViewportP *)0x0) {
      bVar17 = window != (ImGuiWindow *)0x0;
      bVar18 = false;
      local_1d0 = (ImDrawList *)0x0;
    }
    else {
      local_1d0 = GetViewportDrawList(viewport,1,"##Foreground");
      bVar17 = window != (ImGuiWindow *)0x0;
      bVar18 = local_1d0 != (ImDrawList *)0x0;
      if (bVar17 && bVar18) {
        bVar17 = IsItemHovered(0);
        bVar18 = true;
        if (bVar17) {
          local_168[0].y = (window->Size).y + (window->Pos).y;
          local_168[0].x = (window->Size).x + (window->Pos).x;
          ImDrawList::AddRect(local_1d0,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0,1.0);
        }
        bVar17 = true;
      }
    }
    draw_list_00 = local_1b8;
    pIVar11 = local_1c0;
    pIVar9 = local_1d0;
    if (!bVar4) {
      return;
    }
    if ((bVar17) && (window->WasActive == false)) {
      TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
    }
    if (0 < iVar13) {
      pIVar16 = (draw_list_00->CmdBuffer).Data;
      local_1a8 = (long)iVar13 * 0x38;
      do {
        if (pIVar16->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString((char *)local_168,300,
                         "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         SUB84((double)(pIVar16->ClipRect).x,0),
                         SUB84((double)(pIVar16->ClipRect).y,0),(double)(pIVar16->ClipRect).z,
                         (double)(pIVar16->ClipRect).w,(ulong)pIVar16->ElemCount / 3,
                         pIVar16->TextureId);
          bVar4 = TreeNode((void *)(((long)pIVar16 - (long)(draw_list_00->CmdBuffer).Data >> 3) *
                                   0x6db6db6db6db6db7),"%s",local_168);
          bVar17 = IsItemHovered(0);
          if (bVar17) {
            if ((pIVar11->DebugMetricsConfig).ShowDrawCmdMesh == false) {
              if (((pIVar11->DebugMetricsConfig).ShowDrawCmdBoundingBoxes & bVar18) == 1) {
                show_mesh = false;
                bVar17 = true;
                goto LAB_00147a80;
              }
            }
            else if (bVar18 != false) {
              bVar17 = (pIVar11->DebugMetricsConfig).ShowDrawCmdBoundingBoxes;
              show_mesh = true;
LAB_00147a80:
              DebugNodeDrawCmdShowMeshAndBoundingBox(pIVar9,draw_list_00,pIVar16,show_mesh,bVar17);
            }
          }
          if (bVar4) {
            if ((draw_list_00->IdxBuffer).Size < 1) {
              puVar12 = (unsigned_short *)0x0;
            }
            else {
              puVar12 = (draw_list_00->IdxBuffer).Data;
            }
            uVar1 = pIVar16->VtxOffset;
            uVar8 = pIVar16->IdxOffset;
            pIVar3 = (draw_list_00->VtxBuffer).Data;
            uVar5 = pIVar16->ElemCount + uVar8;
            uVar19 = 0;
            if (uVar8 < uVar5) {
              fVar20 = 0.0;
              do {
                local_1f8.DisplayStart = 0;
                local_1f8.DisplayEnd = 0;
                local_1f8.ItemsCount = 0;
                local_1f8.StepNo = 0;
                local_1f8.ItemsFrozen = 0;
                local_1f8.ItemsHeight = 0.0;
                lVar14 = 0;
                do {
                  uVar10 = (uint)((ulong)uVar8 + lVar14);
                  if (puVar12 != (unsigned_short *)0x0) {
                    uVar10 = (uint)puVar12[(ulong)uVar8 + lVar14 & 0xffffffff];
                  }
                  *(ImVec2 *)(&local_1f8.DisplayStart + lVar14 * 2) =
                       pIVar3[(ulong)uVar1 + (ulong)uVar10].pos;
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                fVar20 = fVar20 + ABS(((float)local_1f8.DisplayEnd - (float)local_1f8.StepNo) *
                                      (float)local_1f8.ItemsFrozen +
                                      ((float)local_1f8.StepNo - local_1f8.ItemsHeight) *
                                      (float)local_1f8.DisplayStart +
                                      (local_1f8.ItemsHeight - (float)local_1f8.DisplayEnd) *
                                      (float)local_1f8.ItemsCount) * 0.5;
                uVar8 = uVar8 + 3;
              } while (uVar8 < uVar5);
              uVar19 = SUB84((double)fVar20,0);
            }
            ImFormatString((char *)local_168,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           uVar19);
            local_1f8.DisplayStart = 0;
            local_1f8.DisplayEnd = 0;
            Selectable((char *)local_168,false,0,(ImVec2 *)&local_1f8);
            bVar4 = IsItemHovered(0);
            if ((bVar18 & bVar4) != 0) {
              DebugNodeDrawCmdShowMeshAndBoundingBox(pIVar9,draw_list_00,pIVar16,true,false);
            }
            local_1f8.DisplayStart = 0;
            local_1f8.DisplayEnd = 0;
            local_1f8.StepNo = 0;
            local_1f8.ItemsFrozen = 0;
            local_1f8.ItemsHeight = 0.0;
            local_1f8.StartPosY = 0.0;
            local_1f8.ItemsCount = -1;
            uVar8 = pIVar16->ElemCount;
            pIVar2 = GImGui->CurrentWindow;
            table = GImGui->CurrentTable;
            local_1b0 = pIVar16;
            if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
              TableEndRow(table);
            }
            local_1f8.StartPosY = (pIVar2->DC).CursorPos.y;
            local_1f8.ItemsHeight = -1.0;
            local_1f8.ItemsCount = uVar8 / 3;
            local_1f8.StepNo = 0;
            local_1f8.ItemsFrozen = 0;
            local_1f8.DisplayStart = -1;
            local_1f8.DisplayEnd = 0;
            while (bVar4 = ImGuiListClipper::Step(&local_1f8), bVar4) {
              local_1c4 = local_1f8.DisplayEnd;
              if (local_1f8.DisplayStart < local_1f8.DisplayEnd) {
                uVar15 = (ulong)(local_1f8.DisplayStart * 3 + local_1b0->IdxOffset);
                uVar8 = local_1f8.DisplayStart;
                do {
                  local_1a0 = (ulong)uVar8;
                  local_188[0].x = 0.0;
                  local_188[0].y = 0.0;
                  local_188[1].x = 0.0;
                  local_188[1].y = 0.0;
                  local_188[2].x = 0.0;
                  local_188[2].y = 0.0;
                  lVar14 = 0;
                  buf_00 = local_168;
                  local_198 = (long)(int)uVar15;
                  do {
                    if (puVar12 == (unsigned_short *)0x0) {
                      uVar8 = (int)local_198 + (int)lVar14;
                    }
                    else {
                      uVar8 = (uint)puVar12[(int)uVar15 + lVar14];
                    }
                    lVar6 = (long)(int)uVar8;
                    local_188[lVar14] = pIVar3[(ulong)uVar1 + lVar6].pos;
                    pcVar7 = "     ";
                    if (lVar14 == 0) {
                      pcVar7 = "Vert:";
                    }
                    iVar13 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                            "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                            ,SUB84((double)pIVar3[(ulong)uVar1 + lVar6].pos.x,0),
                                            SUB84((double)pIVar3[(ulong)uVar1 + lVar6].pos.y,0),
                                            (double)pIVar3[(ulong)uVar1 + lVar6].uv.x,
                                            (double)pIVar3[(ulong)uVar1 + lVar6].uv.y,pcVar7,
                                            (uVar15 & 0xffffffff) + lVar14,
                                            (ulong)pIVar3[(ulong)uVar1 + lVar6].col);
                    buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar13);
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 3);
                  local_190.x = 0.0;
                  local_190.y = 0.0;
                  Selectable((char *)local_168,false,0,&local_190);
                  if ((bVar18 != false) && (bVar4 = IsItemHovered(0), pIVar9 = local_1d0, bVar4)) {
                    uVar8 = local_1d0->Flags;
                    local_1d0->Flags = uVar8 & 0xfffffffe;
                    ImDrawList::AddPolyline(local_1d0,local_188,3,0xff00ffff,1,1.0);
                    pIVar9->Flags = uVar8;
                  }
                  uVar15 = (uVar15 & 0xffffffff) + 3;
                  uVar8 = (int)local_1a0 + 1;
                } while (uVar8 != local_1c4);
              }
            }
            TreePop();
            pIVar9 = local_1d0;
            pIVar11 = local_1c0;
            draw_list_00 = local_1b8;
            pIVar16 = local_1b0;
            if ((float)local_1f8.ItemsCount != -NAN) {
              __assert_fail("ItemsCount == -1 && \"Forgot to call End(), or to Step() until false?\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                            ,0x934,"ImGuiListClipper::~ImGuiListClipper()");
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar16->UserCallback,pIVar16->UserCallbackData);
        }
        pIVar16 = pIVar16 + 1;
      } while (pIVar16 < (ImDrawCmd *)
                         ((long)&(((draw_list_00->CmdBuffer).Data)->ClipRect).x + local_1a8));
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
    if (window && fg_draw_list && IsItemHovered())
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}